

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O0

int64_t Assimp::strtol10_64(char *in,char **out,uint *max_inout)

{
  char cVar1;
  uint64_t local_30;
  int64_t value;
  bool inv;
  uint *max_inout_local;
  char **out_local;
  char *in_local;
  
  cVar1 = *in;
  if ((cVar1 == '-') || (out_local = (char **)in, *in == '+')) {
    out_local = (char **)(in + 1);
  }
  local_30 = strtoul10_64((char *)out_local,out,max_inout);
  if (cVar1 == '-') {
    local_30 = -local_30;
  }
  return local_30;
}

Assistant:

inline
int64_t strtol10_64(const char* in, const char** out = 0, unsigned int* max_inout = 0) {
    bool inv = (*in == '-');
    if ( inv || *in == '+' ) {
        ++in;
    }

    int64_t value = strtoul10_64(in, out, max_inout);
    if (inv) {
        value = -value;
    }
    return value;
}